

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  char *pcVar1;
  char *pcVar2;
  byte *pbVar3;
  char *pcVar4;
  char *pcVar5;
  byte bVar6;
  char cVar7;
  ulong uVar8;
  undefined8 uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort *puVar12;
  char *pcVar13;
  ulong __n;
  LZ4_byte *pLVar14;
  ushort *puVar15;
  long lVar16;
  size_t __n_00;
  ulong uVar17;
  ushort *__src;
  char *pcVar18;
  char *pcVar19;
  char *__src_00;
  uint uVar20;
  BYTE *s;
  ulong __n_01;
  char *pcVar21;
  BYTE *oCopyLimit;
  int local_70;
  int local_58;
  
  uVar17 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar17 == 0) {
    uVar20 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      if (uVar17 < 0xffff) {
        uVar8 = (LZ4_streamDecode->internal_donotuse).extDictSize;
        if (uVar8 != 0) {
          if (maxOutputSize < 0 || source == (char *)0x0) {
            return -1;
          }
          pLVar14 = (LZ4_streamDecode->internal_donotuse).externalDict + uVar8;
          if ((LZ4_streamDecode->internal_donotuse).externalDict == (LZ4_byte *)0x0) {
            pLVar14 = (LZ4_byte *)0x0;
          }
          if (maxOutputSize == 0) {
            if (compressedSize != 1) {
              return -1;
            }
            return -(uint)(*source != '\0');
          }
          if (compressedSize == 0) {
            return -1;
          }
          __src_00 = dest + -uVar17;
          pbVar3 = (byte *)(source + compressedSize);
          pcVar4 = dest + (uint)maxOutputSize;
          pcVar1 = pcVar4 + -7;
          pcVar19 = dest;
          puVar15 = (ushort *)source;
LAB_0011b44c:
          __src = (ushort *)((long)puVar15 + 1);
          bVar6 = (byte)*puVar15;
          __n_00 = (size_t)(uint)(bVar6 >> 4);
          if (bVar6 >> 4 == 0xf) {
            if (pbVar3 + -0xf <= __src) goto LAB_0011b862;
            puVar15 = puVar15 + 1;
            lVar16 = 0;
            puVar12 = __src;
            do {
              __src = (ushort *)((long)puVar12 + 1);
              if (pbVar3 + -0xf < __src) goto LAB_0011b862;
              uVar10 = *puVar12;
              lVar16 = lVar16 + (ulong)(byte)uVar10;
              puVar15 = (ushort *)((long)puVar15 + 1);
              puVar12 = __src;
            } while ((ulong)(byte)uVar10 == 0xff);
            if (((lVar16 == -1) || (__n_00 = lVar16 + 0xf, CARRY8((ulong)pcVar19,__n_00))) ||
               ((ulong)-(long)puVar15 < __n_00)) goto LAB_0011b862;
LAB_0011b4be:
            pcVar21 = pcVar19 + __n_00;
            if ((pcVar4 + -0xc < pcVar21) ||
               (puVar15 = (ushort *)((long)__src + __n_00), pbVar3 + -8 < puVar15)) {
              if (((byte *)((long)__src + __n_00) == pbVar3) && (pcVar21 <= pcVar4)) {
                memmove(pcVar19,__src,__n_00);
                local_70 = (int)dest;
                uVar20 = (int)pcVar21 - local_70;
                goto LAB_0011b86f;
              }
LAB_0011b862:
              local_58 = (int)source;
              uVar20 = ~(uint)__src + local_58;
              goto LAB_0011b86f;
            }
            do {
              *(undefined8 *)pcVar19 = *(undefined8 *)__src;
              pcVar19 = pcVar19 + 8;
              __src = __src + 4;
            } while (pcVar19 < pcVar21);
            uVar10 = *puVar15;
            __src = puVar15 + 1;
            pcVar13 = pcVar21 + -(ulong)uVar10;
            uVar17 = (ulong)(bVar6 & 0xf);
          }
          else {
            if ((source + (long)compressedSize + -0x10 <= __src) ||
               (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar19)) goto LAB_0011b4be;
            uVar9 = *(undefined8 *)((long)puVar15 + 9);
            *(undefined8 *)pcVar19 = *(undefined8 *)__src;
            *(undefined8 *)(pcVar19 + 8) = uVar9;
            pcVar21 = pcVar19 + __n_00;
            uVar17 = (ulong)(bVar6 & 0xf);
            puVar15 = (ushort *)((long)__src + __n_00);
            __src = puVar15 + 1;
            uVar10 = *puVar15;
            pcVar13 = pcVar21 + -(ulong)uVar10;
            if (((uVar17 != 0xf) && (7 < uVar10)) && (__src_00 <= pcVar13)) {
              *(undefined8 *)pcVar21 = *(undefined8 *)pcVar13;
              *(undefined8 *)(pcVar21 + 8) = *(undefined8 *)(pcVar13 + 8);
              *(undefined2 *)(pcVar21 + 0x10) = *(undefined2 *)(pcVar13 + 0x10);
              pcVar19 = pcVar21 + uVar17 + 4;
              puVar15 = __src;
              goto LAB_0011b44c;
            }
          }
          if ((int)uVar17 == 0xf) {
            lVar16 = 0;
            puVar15 = __src;
            do {
              __src = (ushort *)((long)puVar15 + 1);
              if (pbVar3 + -4 < __src) goto LAB_0011b862;
              uVar11 = *puVar15;
              lVar16 = lVar16 + (ulong)(byte)uVar11;
              puVar15 = __src;
            } while ((ulong)(byte)uVar11 == 0xff);
            uVar17 = lVar16 + 0xf;
            if ((lVar16 == -1) || (CARRY8((ulong)pcVar21,uVar17))) goto LAB_0011b862;
          }
          if ((uVar8 < 0x10000) && (pcVar13 + uVar8 < __src_00)) goto LAB_0011b862;
          uVar17 = uVar17 + 4;
          pcVar5 = pcVar21 + uVar17;
          pcVar19 = pcVar5;
          puVar15 = __src;
          if (pcVar13 < __src_00) {
            if (pcVar4 + -5 < pcVar5) goto LAB_0011b862;
            __n_01 = (long)__src_00 - (long)pcVar13;
            __n = uVar17 - __n_01;
            if (uVar17 < __n_01 || __n == 0) {
              memmove(pcVar21,pLVar14 + -__n_01,uVar17);
            }
            else {
              memcpy(pcVar21,pLVar14 + -__n_01,__n_01);
              pcVar19 = pcVar21 + __n_01;
              if ((ulong)((long)pcVar19 - (long)__src_00) < __n) {
                pcVar21 = __src_00;
                if ((long)__n_01 < (long)uVar17) {
                  do {
                    *pcVar19 = *pcVar21;
                    pcVar19 = pcVar19 + 1;
                    pcVar21 = pcVar21 + 1;
                  } while (pcVar19 < pcVar5);
                }
              }
              else {
                memcpy(pcVar19,__src_00,__n);
                pcVar19 = pcVar5;
              }
            }
          }
          else {
            if (uVar10 < 8) {
              pcVar21[0] = '\0';
              pcVar21[1] = '\0';
              pcVar21[2] = '\0';
              pcVar21[3] = '\0';
              *pcVar21 = *pcVar13;
              pcVar21[1] = pcVar13[1];
              pcVar21[2] = pcVar13[2];
              pcVar21[3] = pcVar13[3];
              uVar20 = inc32table[uVar10];
              *(undefined4 *)(pcVar21 + 4) = *(undefined4 *)(pcVar13 + uVar20);
              pcVar13 = pcVar13 + ((ulong)uVar20 - (long)dec64table[uVar10]);
            }
            else {
              *(undefined8 *)pcVar21 = *(undefined8 *)pcVar13;
              pcVar13 = pcVar13 + 8;
            }
            pcVar2 = pcVar21 + 8;
            if (pcVar4 + -0xc < pcVar5) {
              if (pcVar4 + -5 < pcVar5) goto LAB_0011b862;
              pcVar21 = pcVar13;
              pcVar18 = pcVar2;
              if (pcVar2 < pcVar1) {
                do {
                  *(undefined8 *)pcVar18 = *(undefined8 *)pcVar21;
                  pcVar18 = pcVar18 + 8;
                  pcVar21 = pcVar21 + 8;
                } while (pcVar18 < pcVar1);
                pcVar13 = pcVar13 + ((long)pcVar1 - (long)pcVar2);
                pcVar2 = pcVar1;
              }
              for (; pcVar2 < pcVar5; pcVar2 = pcVar2 + 1) {
                cVar7 = *pcVar13;
                pcVar13 = pcVar13 + 1;
                *pcVar2 = cVar7;
              }
            }
            else {
              *(undefined8 *)pcVar2 = *(undefined8 *)pcVar13;
              if (0x10 < uVar17) {
                pcVar21 = pcVar21 + 0x10;
                do {
                  pcVar13 = pcVar13 + 8;
                  *(undefined8 *)pcVar21 = *(undefined8 *)pcVar13;
                  pcVar21 = pcVar21 + 8;
                } while (pcVar21 < pcVar5);
              }
            }
          }
          goto LAB_0011b44c;
        }
        uVar20 = LZ4_decompress_safe_withSmallPrefix
                           (source,dest,compressedSize,maxOutputSize,uVar17);
      }
      else {
        uVar20 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
      }
LAB_0011b86f:
      if ((int)uVar20 < 1) {
        return uVar20;
      }
      (LZ4_streamDecode->internal_donotuse).prefixSize =
           (LZ4_streamDecode->internal_donotuse).prefixSize + (ulong)uVar20;
      (LZ4_streamDecode->internal_donotuse).prefixEnd =
           (LZ4_streamDecode->internal_donotuse).prefixEnd + uVar20;
      return uVar20;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar17;
    pLVar14 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar17;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar14;
    uVar20 = LZ4_decompress_safe_forceExtDict
                       (source,dest,compressedSize,maxOutputSize,pLVar14,uVar17);
  }
  if (0 < (int)uVar20) {
    (LZ4_streamDecode->internal_donotuse).prefixSize = (ulong)uVar20;
    (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + uVar20);
  }
  return uVar20;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}